

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Node.hpp
# Opt level: O1

void __thiscall CX3DImporter_NodeElement::~CX3DImporter_NodeElement(CX3DImporter_NodeElement *this)

{
  ~CX3DImporter_NodeElement(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~CX3DImporter_NodeElement() {
        // empty
    }